

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

void __thiscall
pybind11::detail::loader_life_support::loader_life_support(loader_life_support *this)

{
  internals *piVar1;
  value_type local_18;
  loader_life_support *local_10;
  loader_life_support *this_local;
  
  local_10 = this;
  piVar1 = get_internals();
  local_18 = (value_type)0x0;
  std::vector<_object_*,_std::allocator<_object_*>_>::push_back
            (&piVar1->loader_patient_stack,&local_18);
  return;
}

Assistant:

loader_life_support() {
        get_internals().loader_patient_stack.push_back(nullptr);
    }